

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O2

uint16_t * __thiscall
icu_63::Normalizer2Impl::getCompositionsList(Normalizer2Impl *this,uint16_t norm16)

{
  uint16_t *puVar1;
  
  if ((this->minYesNo <= norm16) && (norm16 < this->minMaybeYes)) {
    return (uint16_t *)
           ((long)this->extraData +
           (ulong)(*(ushort *)((long)this->extraData + (ulong)(norm16 & 0xfffe)) & 0x1f) * 2 +
           (ulong)(norm16 & 0xfffe) + 2);
  }
  puVar1 = getCompositionsListForDecompYes(this,norm16);
  return puVar1;
}

Assistant:

UBool isDecompYes(uint16_t norm16) const { return norm16<minYesNo || minMaybeYes<=norm16; }